

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

int32 ngram_model_init(ngram_model_t *base,ngram_funcs_t *funcs,logmath_t *lmath,int32 n,
                      int32 n_unigram)

{
  int iVar1;
  uint32 *puVar2;
  char **ppcVar3;
  hash_table_t *phVar4;
  long lVar5;
  
  base->refcount = 1;
  base->funcs = funcs;
  base->n = (uint8)n;
  if (base->n_counts == (uint32 *)0x0) {
    puVar2 = (uint32 *)
             __ckd_calloc__((long)n,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0xd3);
    base->n_counts = puVar2;
  }
  if (base->lmath != lmath) {
    base->lw = 1.0;
    base->log_wip = 0;
    iVar1 = logmath_get_zero(lmath);
    base->log_zero = iVar1;
    base->lmath = lmath;
  }
  ppcVar3 = base->word_str;
  if (ppcVar3 == (char **)0x0) {
    ppcVar3 = (char **)__ckd_calloc__((long)n_unigram,8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                      ,0xeb);
  }
  else {
    if ((base->writable != '\0') && (0 < base->n_words)) {
      lVar5 = 0;
      do {
        ckd_free(base->word_str[lVar5]);
        base->word_str[lVar5] = (char *)0x0;
        lVar5 = lVar5 + 1;
      } while (lVar5 < base->n_words);
      ppcVar3 = base->word_str;
    }
    ppcVar3 = (char **)__ckd_realloc__(ppcVar3,(long)n_unigram << 3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                       ,0xe8);
  }
  base->word_str = ppcVar3;
  if (base->wid == (hash_table_t *)0x0) {
    phVar4 = hash_table_new(n_unigram,0);
    base->wid = phVar4;
  }
  else {
    hash_table_empty(base->wid);
  }
  base->n_words = n_unigram;
  base->n_1g_alloc = n_unigram;
  *base->n_counts = n_unigram;
  return 0;
}

Assistant:

int32
ngram_model_init(ngram_model_t * base,
                 ngram_funcs_t * funcs,
                 logmath_t * lmath, int32 n, int32 n_unigram)
{
    base->refcount = 1;
    base->funcs = funcs;
    base->n = n;
    /* If this was previously initialized... */
    if (base->n_counts == NULL)
        base->n_counts = (uint32 *) ckd_calloc(n, sizeof(*base->n_counts));
    /* Don't reset weights if logmath object hasn't changed. */
    if (base->lmath != lmath) {
        /* Set default values for weights. */
        base->lw = 1.0;
        base->log_wip = 0;      /* i.e. 1.0 */
        base->log_zero = logmath_get_zero(lmath);
        base->lmath = lmath;
    }
    /* Allocate or reallocate space for word strings. */
    if (base->word_str) {
        /* Free all previous word strings if they were allocated. */
        if (base->writable) {
            int32 i;
            for (i = 0; i < base->n_words; ++i) {
                ckd_free(base->word_str[i]);
                base->word_str[i] = NULL;
            }
        }
        base->word_str =
            (char **) ckd_realloc(base->word_str,
                                  n_unigram * sizeof(char *));
    }
    else {
        base->word_str = (char **) ckd_calloc(n_unigram, sizeof(char *));
    }
    /* NOTE: They are no longer case-insensitive since we are allowing
     * other encodings for word strings.  Beware. */
    if (base->wid)
        hash_table_empty(base->wid);
    else
        base->wid = hash_table_new(n_unigram, FALSE);
    base->n_counts[0] = base->n_1g_alloc = base->n_words = n_unigram;

    return 0;
}